

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bv.c
# Opt level: O2

void bv_init(bv_t *bv,uchar *data,uint len)

{
  uint __line;
  char *__assertion;
  
  if (bv == (bv_t *)0x0) {
    __assertion = "bv != NULL";
    __line = 0x32;
  }
  else {
    if (data != (uchar *)0x0) {
      bv->data = data;
      bv->len = len;
      bv->idx = 0;
      return;
    }
    __assertion = "data != NULL";
    __line = 0x33;
  }
  __assert_fail(__assertion,"/workspace/llm4binary/github/license_c_cmakelists/wesen[P]poc/bv.c",
                __line,"void bv_init(bv_t *, unsigned char *, unsigned int)");
}

Assistant:

void bv_init(bv_t *bv, unsigned char *data, unsigned int len) {
  assert(bv != NULL);
  assert(data != NULL);
  
  bv->data = data;
  bv->len  = len;
  bv->idx  = 0;
}